

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O2

void Disa::forward_sweep(Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
                        Vector_Dense<double,_0UL> *x_update,Vector_Dense<double,_0UL> *b_vector,
                        Scalar omega)

{
  pointer puVar1;
  bool bVar2;
  Scalar *pSVar3;
  long lVar4;
  double dVar5;
  const_iterator column_iter;
  double local_b0;
  pointer local_a8;
  double local_a0;
  Vector_Dense<double,_0UL> *local_98;
  Vector_Dense<double,_0UL> *local_90;
  Scalar local_88;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_80;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_60;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_50;
  
  local_a0 = 1.0 - omega;
  local_a8 = (pointer)0x0;
  local_98 = x_update;
  local_90 = b_vector;
  local_88 = omega;
  while( true ) {
    lVar4 = (long)(a_matrix->row_non_zero).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(a_matrix->row_non_zero).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((lVar4 == 0) || ((pointer)((lVar4 >> 3) - 1U) <= local_a8)) break;
    local_50 = Matrix_Sparse::operator[](a_matrix,(size_t *)&local_a8);
    Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cbegin((const_iterator *)&local_80,&local_50);
    local_b0 = 0.0;
    while( true ) {
      local_60 = Matrix_Sparse::operator[](a_matrix,(size_t *)&local_a8);
      Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::cend((const_iterator *)&local_50,&local_60);
      bVar2 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                        ((const_iterator *)&local_80,(const_iterator *)&local_50);
      if (!bVar2) break;
      puVar1 = ((local_80.matrix)->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar1 != local_a8) {
        local_b0 = local_b0 +
                   *(double *)local_80.row_index *
                   (x_vector->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)puVar1];
      }
      local_80.row_index = (size_t)(local_80.row_index + 8);
      local_80.matrix =
           (Matrix_Sparse *)
           &((local_80.matrix)->row_non_zero).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
    }
    dVar5 = ((local_90->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[(long)local_a8] - local_b0) * local_88;
    local_80 = Matrix_Sparse::operator[](a_matrix,(size_t *)&local_a8);
    pSVar3 = Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator[](&local_80,(size_t *)&local_a8)
    ;
    (local_98->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [(long)local_a8] =
         (x_vector->super_vector<double,_std::allocator<double>_>).
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[(long)local_a8] * local_a0 + dVar5 / *pSVar3;
    local_a8 = (pointer)((long)local_a8 + 1);
  }
  return;
}

Assistant:

inline void forward_sweep(const Matrix_Sparse& a_matrix, const Vector_Dense<Scalar, 0>& x_vector,
                          Vector_Dense<Scalar, 0>& x_update, const Vector_Dense<Scalar, 0>& b_vector,
                          const Scalar omega = 1) {
  // forward sweep
  FOR(i_row, a_matrix.size_row()) {
    Scalar offs_row_dot = 0;
    FOR_ITER(column_iter, a_matrix[i_row])
    if(column_iter.i_column() != i_row) offs_row_dot += *column_iter * x_vector[column_iter.i_column()];
    x_update[i_row] =
    omega * (b_vector[i_row] - offs_row_dot) / a_matrix[i_row][i_row] + (1.0 - omega) * x_vector[i_row];
  }
}